

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

l2_expr_info *
l2_eval_expr_eq_ne1(l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,
                   l2_expr_info left_expr_info)

{
  l2_expr_info left_expr_info_00;
  l2_expr_info lVar1;
  undefined1 uVar2;
  boolean bVar3;
  double dVar4;
  l2_expr_info local_78;
  l2_expr_info local_60;
  l2_token *local_48;
  l2_token *current_token_p;
  l2_expr_info new_left_expr_info;
  l2_expr_info right_expr_info;
  l2_scope *scope_p_local;
  
  lVar1 = left_expr_info;
  bVar3 = l2_parse_probe_next_token_by_type(L2_TOKEN_EQUAL);
  uVar2 = left_expr_info.val.bool;
  if (bVar3 == '\0') {
    bVar3 = l2_parse_probe_next_token_by_type(L2_TOKEN_NOT_EQUAL);
    if (bVar3 == '\0') {
      __return_storage_ptr__->val_type = left_expr_info.val_type;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = left_expr_info._4_4_;
      (__return_storage_ptr__->val).real = left_expr_info.val.real;
      left_expr_info.val.procedure.upper_scope_p = lVar1.val._8_8_;
      (__return_storage_ptr__->val).procedure.upper_scope_p =
           left_expr_info.val.procedure.upper_scope_p;
    }
    else {
      l2_parse_token_forward();
      local_48 = l2_parse_token_current();
      l2_eval_expr_gt_lt_ge_le(&local_78,scope_p);
      new_left_expr_info.val._8_4_ = local_78.val_type;
      new_left_expr_info.val._12_4_ = local_78._4_4_;
      current_token_p._0_4_ = 4;
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (local_78.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          new_left_expr_info.val_type._0_1_ =
               left_expr_info.val.integer !=
               CONCAT44(local_78.val.integer._4_4_,local_78.val.procedure.entry_pos);
        }
        else {
          if (local_78.val_type != L2_EXPR_VAL_TYPE_REAL) {
            if (local_78.val_type == L2_EXPR_VAL_TYPE_BOOL) {
              l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                               local_48->current_line,local_48->current_col,"!=","integer","bool");
            }
            l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                             local_48->current_col);
          }
          new_left_expr_info.val_type._0_1_ =
               (double)left_expr_info.val.integer !=
               (double)CONCAT44(local_78.val.integer._4_4_,local_78.val.procedure.entry_pos);
        }
      }
      else if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        if (local_78.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          dVar4 = (double)CONCAT44(local_78.val.integer._4_4_,local_78.val.procedure.entry_pos);
        }
        else {
          if (local_78.val_type != L2_EXPR_VAL_TYPE_REAL) {
            if (local_78.val_type == L2_EXPR_VAL_TYPE_BOOL) {
              l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                               local_48->current_line,local_48->current_col,"!=","real","bool");
            }
            l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                             local_48->current_col);
          }
          dVar4 = (double)CONCAT44(local_78.val.integer._4_4_,local_78.val.procedure.entry_pos);
        }
        new_left_expr_info.val_type._0_1_ = left_expr_info.val.real != dVar4;
      }
      else {
        if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_BOOL) {
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                           local_48->current_col);
        }
        if (local_78.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,"!=","bool","integer");
        }
        if (local_78.val_type == L2_EXPR_VAL_TYPE_REAL) {
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,"!=","bool","real");
        }
        if (local_78.val_type != L2_EXPR_VAL_TYPE_BOOL) {
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                           local_48->current_col);
        }
        right_expr_info.val_type._0_1_ = (undefined1)local_78.val.procedure.entry_pos;
        new_left_expr_info.val_type._0_1_ = uVar2 != (undefined1)right_expr_info.val_type;
      }
      lVar1._4_4_ = current_token_p._4_4_;
      lVar1.val_type = 4;
      lVar1.val.integer._1_7_ = new_left_expr_info._1_7_;
      lVar1.val.bool = (undefined1)new_left_expr_info.val_type;
      lVar1.val._8_8_ = new_left_expr_info.val.real;
      l2_eval_expr_eq_ne1(__return_storage_ptr__,scope_p,lVar1);
    }
  }
  else {
    l2_parse_token_forward();
    local_48 = l2_parse_token_current();
    l2_eval_expr_gt_lt_ge_le(&local_60,scope_p);
    new_left_expr_info.val._8_4_ = local_60.val_type;
    new_left_expr_info.val._12_4_ = local_60._4_4_;
    current_token_p._0_4_ = 4;
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
      if (local_60.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        new_left_expr_info.val_type._0_1_ =
             left_expr_info.val.integer ==
             CONCAT44(local_60.val.integer._4_4_,local_60.val.procedure.entry_pos);
      }
      else {
        if (local_60.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (local_60.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,"==","integer","bool");
          }
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                           local_48->current_col);
        }
        new_left_expr_info.val_type._0_1_ =
             (double)left_expr_info.val.integer ==
             (double)CONCAT44(local_60.val.integer._4_4_,local_60.val.procedure.entry_pos);
      }
    }
    else if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
      if (local_60.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        dVar4 = (double)CONCAT44(local_60.val.integer._4_4_,local_60.val.procedure.entry_pos);
      }
      else {
        if (local_60.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (local_60.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,"==","real","bool");
          }
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                           local_48->current_col);
        }
        dVar4 = (double)CONCAT44(local_60.val.integer._4_4_,local_60.val.procedure.entry_pos);
      }
      new_left_expr_info.val_type._0_1_ = left_expr_info.val.real == dVar4;
    }
    else {
      if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_BOOL) {
        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                         local_48->current_col);
      }
      if (local_60.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_48->current_line,local_48->current_col,"==","bool","integer");
      }
      if (local_60.val_type == L2_EXPR_VAL_TYPE_REAL) {
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_48->current_line,local_48->current_col,"==","bool","real");
      }
      if (local_60.val_type != L2_EXPR_VAL_TYPE_BOOL) {
        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                         local_48->current_col);
      }
      right_expr_info.val_type._0_1_ = (undefined1)local_60.val.procedure.entry_pos;
      new_left_expr_info.val_type._0_1_ = uVar2 == (undefined1)right_expr_info.val_type;
    }
    left_expr_info_00._4_4_ = current_token_p._4_4_;
    left_expr_info_00.val_type = 4;
    left_expr_info_00.val.integer._1_7_ = new_left_expr_info._1_7_;
    left_expr_info_00.val.bool = (undefined1)new_left_expr_info.val_type;
    left_expr_info_00.val._8_8_ = new_left_expr_info.val.real;
    l2_eval_expr_eq_ne1(__return_storage_ptr__,scope_p,left_expr_info_00);
  }
  return __return_storage_ptr__;
}

Assistant:

l2_expr_info l2_eval_expr_eq_ne1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p
    _if_type (L2_TOKEN_EQUAL) /* == */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_gt_lt_ge_le(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.integer == right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = ((double)left_expr_info.val.integer == right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        new_left_expr_info.val.bool = (left_expr_info.val.bool == right_expr_info.val.bool);
                        break;

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.real == (double)right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "==", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = (left_expr_info.val.real == right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_eq_ne1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_NOT_EQUAL) /* != */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_gt_lt_ge_le(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.integer != right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = ((double)left_expr_info.val.integer != right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        new_left_expr_info.val.bool = (left_expr_info.val.bool != right_expr_info.val.bool);
                        break;

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.bool = (left_expr_info.val.real != (double)right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!=", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val.bool = (left_expr_info.val.real != right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_eq_ne1(scope_p, new_left_expr_info);

    }
    _else
    {
        return left_expr_info;
    }
}